

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollArea::mousePressEvent(AbstractScrollArea *this,QMouseEvent *e)

{
  int iVar1;
  AbstractScrollAreaPrivate *this_00;
  QPoint QVar2;
  
  iVar1 = *(int *)(e + 0x40);
  if (iVar1 == 1) {
    QVar2 = QMouseEvent::pos(e);
    ((this->d).d)->mousePos = QVar2;
    this_00 = (this->d).d;
    this_00->leftMouseButtonPressed = true;
    AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation(this_00);
  }
  e[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
AbstractScrollArea::mousePressEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		d->mousePos = e->pos();
		d->leftMouseButtonPressed = true;
		d->stopScrollIndicatorsAnimation();

		e->accept();
	}
	else
		e->ignore();
}